

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bson_decimal128.hpp
# Opt level: O2

decimal128_to_chars_result
jsoncons::bson::decimal128_to_chars(char *first,char *last,decimal128_t *dec)

{
  uint32_t uVar1;
  uint uVar2;
  uint64_t uVar3;
  char cVar4;
  size_t i;
  ulong uVar5;
  long lVar6;
  char *__dest;
  char *pcVar7;
  char *pcVar8;
  uint uVar9;
  int iVar10;
  uint uVar11;
  uint uVar12;
  int k;
  int iVar13;
  undefined8 uVar14;
  uint32_t *__s;
  decimal128_to_chars_result dVar15;
  bson_uint128_t value;
  bson_uint128_t significand128;
  string s;
  string bson_decimal128_nan;
  string bson_decimal128_inf;
  uint32_t significand [36];
  uint32_t *rem;
  
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&bson_decimal128_inf,"Infinity",(allocator<char> *)significand);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&bson_decimal128_nan,"NaN",(allocator<char> *)significand);
  __s = significand;
  memset(__s,0,0x90);
  uVar3 = dec->high;
  __dest = first;
  if ((long)uVar3 < 0) {
    __dest = first + 1;
    *first = '-';
    uVar3 = dec->high;
  }
  uVar5 = dec->low;
  uVar11 = (uint)(uVar3 >> 0x20);
  if ((~uVar11 & 0x60000000) == 0) {
    uVar12 = uVar11 >> 0x1a & 0x1f;
    if (uVar12 == 0x1f) {
      __dest = first;
      if ((long)bson_decimal128_nan._M_string_length <= (long)last - (long)first) {
        memcpy(first,bson_decimal128_nan._M_dataplus._M_p,bson_decimal128_nan._M_string_length);
        __dest = first + bson_decimal128_nan._M_string_length;
      }
      *__dest = '\0';
      uVar14 = 0;
      goto LAB_001a196c;
    }
    if (uVar12 != 0x1e) {
      uVar12 = uVar11 >> 0xf;
      uVar9 = uVar11 >> 0xe & 1 | 8;
      goto LAB_001a1740;
    }
    if ((long)bson_decimal128_inf._M_string_length <= (long)last - (long)__dest) {
      memcpy(__dest,bson_decimal128_inf._M_dataplus._M_p,bson_decimal128_inf._M_string_length);
      __dest = __dest + bson_decimal128_inf._M_string_length;
    }
    *__dest = '\0';
  }
  else {
    uVar9 = uVar11 >> 0xe & 7;
    uVar12 = uVar11 >> 0x11;
LAB_001a1740:
    uVar12 = uVar12 & 0x3fff;
    significand128.parts[0] = uVar9 << 0xe | uVar11 & 0x3fff;
    significand128.parts[1] = (uint32_t)uVar3;
    significand128.parts[2] = (uint32_t)(uVar5 >> 0x20);
    significand128.parts[3] = (uint32_t)uVar5;
    uVar11 = significand128.parts[0] | significand128.parts[1] | significand128.parts[3];
    rem = (uint32_t *)(ulong)uVar11;
    if ((uVar9 < 8) && (uVar11 != 0 || uVar5 >> 0x20 != 0)) {
      uVar11 = 0x23;
      for (iVar13 = 3; -1 < iVar13; iVar13 = iVar13 + -1) {
        s._M_dataplus._M_p = s._M_dataplus._M_p & 0xffffffff00000000;
        value.parts[1] = significand128.parts[3];
        value.parts[0] = significand128.parts[2];
        value.parts._8_8_ = &significand128;
        detail::bson_uint128_divide1B
                  ((detail *)CONCAT44(significand128.parts[1],significand128.parts[0]),value,
                   (bson_uint128_t *)&s,rem);
        if ((uint)s._M_dataplus._M_p != 0) {
          uVar2 = (uint)s._M_dataplus._M_p;
          uVar9 = uVar11;
          for (iVar10 = 8; -1 < iVar10; iVar10 = iVar10 + -1) {
            significand[uVar9] = uVar2 % 10;
            uVar9 = uVar9 - 1;
            uVar2 = uVar2 / 10;
          }
        }
        uVar11 = uVar11 - 9;
      }
      uVar11 = 0x24;
      while( true ) {
        if (*__s != 0) break;
        uVar11 = uVar11 - 1;
        __s = __s + 1;
      }
      cVar4 = (char)*__s + '0';
    }
    else {
      __s = significand;
      significand[0] = 0;
      uVar11 = 1;
      cVar4 = '0';
    }
    iVar13 = uVar11 + (uVar12 - 0x1820) + -1;
    if ((0x1820 < uVar12) || (iVar13 < -6)) {
      *__dest = cVar4;
      if (uVar11 - 1 == 0) {
        pcVar8 = __dest + 1;
      }
      else {
        __dest[1] = '.';
        pcVar8 = __dest + 2;
      }
      pcVar7 = pcVar8;
      for (uVar5 = 0;
          (__dest = pcVar7 + 1, uVar5 < uVar11 - 1 &&
          ((long)(pcVar8 + (uVar5 - (long)first)) < 0x24)); uVar5 = uVar5 + 1) {
        *pcVar7 = (char)__s[uVar5 + 1] + '0';
        pcVar7 = __dest;
      }
      *pcVar7 = 'E';
      s._M_dataplus._M_p = (pointer)&s.field_2;
      s._M_string_length = 0;
      s.field_2._M_local_buf[0] = '\0';
      if (-1 < iVar13) {
        std::__cxx11::string::push_back((char)&s);
      }
      jsoncons::detail::from_integer<int,std::__cxx11::string>(iVar13,&s);
      if (__dest + s._M_string_length < last) {
        memcpy(__dest,s._M_dataplus._M_p,s._M_string_length);
        __dest = __dest + s._M_string_length;
        uVar14 = 0;
      }
      else {
        uVar14 = 0x4b;
      }
      std::__cxx11::string::~string((string *)&s);
      goto LAB_001a196c;
    }
    if (uVar12 < 0x1820) {
      iVar13 = (uVar12 - 0x1820) + uVar11;
      if (iVar13 < 1) {
        *__dest = '0';
        pcVar8 = __dest + 1;
      }
      else {
        for (lVar6 = 0; (pcVar8 = __dest + lVar6, (int)lVar6 < iVar13 && (pcVar8 < last));
            lVar6 = lVar6 + 1) {
          uVar1 = *__s;
          __s = __s + 1;
          *pcVar8 = (char)uVar1 + '0';
        }
      }
      *pcVar8 = '.';
      __dest = pcVar8;
      for (iVar10 = iVar13; __dest = __dest + 1, iVar10 < 0; iVar10 = iVar10 + 1) {
        *__dest = '0';
      }
      uVar14 = 0;
      if (iVar13 < 1) {
        iVar13 = 0;
      }
      uVar5 = 0;
      for (; (uVar5 < uVar11 - iVar13 && (__dest < last)); __dest = __dest + 1) {
        *__dest = (char)__s[uVar5] + '0';
        uVar5 = uVar5 + 1;
      }
      goto LAB_001a196c;
    }
    for (uVar5 = 0; (uVar5 < uVar11 && ((long)(__dest + (uVar5 - (long)first)) < 0x24));
        uVar5 = uVar5 + 1) {
      __dest[uVar5] = (char)__s[uVar5] + '0';
    }
    __dest = __dest + uVar5;
  }
  uVar14 = 0;
LAB_001a196c:
  std::__cxx11::string::~string((string *)&bson_decimal128_nan);
  std::__cxx11::string::~string((string *)&bson_decimal128_inf);
  dVar15._8_8_ = uVar14;
  dVar15.ptr = __dest;
  return dVar15;
}

Assistant:

inline
    decimal128_to_chars_result decimal128_to_chars(char* first, char* last, const decimal128_t& dec)
    {
        const std::string bson_decimal128_inf = "Infinity";
        const std::string bson_decimal128_nan = "NaN";

        const uint32_t combination_mask = 0x1f;   /* Extract least significant 5 bits */
        const uint32_t exponent_mask = 0x3fff;    /* Extract least significant 14 bits */
        const uint32_t combination_infinity = 30; /* Value of combination field for Inf */
        const uint32_t combination_nan = 31;      /* Value of combination field for NaN */
        const uint32_t exponent_bias = 6176;      /* decimal128 exponent bias */

        char* str_out = first;      /* output pointer in string */
        char significand_str[35]; /* decoded significand digits */

        /* Note: bits in this routine are referred to starting at 0, */
        /* from the sign bit, towards the coefficient. */
        uint32_t high;                   /* bits 0 - 31 */
        uint32_t midh;                   /* bits 32 - 63 */
        uint32_t midl;                   /* bits 64 - 95 */
        uint32_t low;                    /* bits 96 - 127 */
        uint32_t combination;            /* bits 1 - 5 */
        uint32_t biased_exponent;        /* decoded biased exponent (14 bits) */
        uint32_t significand_digits = 0; /* the number of significand digits */
        uint32_t significand[36] = {0};  /* the base-10 digits in the significand */
        uint32_t *significand_read = significand; /* read pointer into significand */
        int32_t exponent;                         /* unbiased exponent */
        int32_t scientific_exponent; /* the exponent if scientific notation is
                                      * used */
        bool is_zero = false;        /* true if the number is zero */
 
        uint8_t significand_msb; /* the most signifcant significand bits (50-46) */
        bson_uint128_t
           significand128; /* temporary storage for significand decoding */
 
        memset (significand_str, 0, sizeof (significand_str));
 
        if ((int64_t) dec.high < 0) { /* negative */
           *(str_out++) = '-';
        }
 
        low = (uint32_t) dec.low, midl = (uint32_t) (dec.low >> 32),
        midh = (uint32_t) dec.high, high = (uint32_t) (dec.high >> 32);
 
        /* Decode combination field and exponent */
        combination = (high >> 26) & combination_mask;
 
        if (JSONCONS_UNLIKELY ((combination >> 3) == 3)) {
           /* Check for 'special' values */
           if (combination == combination_infinity) { /* Infinity */
               if (last-str_out >= static_cast<ptrdiff_t >(bson_decimal128_inf.size())) 
               {
                   std::memcpy(str_out, bson_decimal128_inf.data(), bson_decimal128_inf.size());
                   str_out += bson_decimal128_inf.size();
               }
               *str_out = 0;
              //strcpy_s (str_out, last-str_out, bson_decimal128_inf.c_str());
              return decimal128_to_chars_result{str_out, std::errc()};
           } else if (combination == combination_nan) { /* NaN */
               /* first, not str_out, to erase the sign */
               str_out = first;
               if (last-str_out >= static_cast<ptrdiff_t >(bson_decimal128_nan.size())) 
               {
                   std::memcpy(str_out, bson_decimal128_nan.data(), bson_decimal128_nan.size());
                   str_out += bson_decimal128_nan.size();
               }
               *str_out = 0;
              //strcpy_s (first, last-first, bson_decimal128_nan.c_str());
              /* we don't care about the NaN payload. */
               return decimal128_to_chars_result{str_out, std::errc()};
           } else {
              biased_exponent = (high >> 15) & exponent_mask;
              significand_msb = 0x8 + ((high >> 14) & 0x1);
           }
        } else {
           significand_msb = (high >> 14) & 0x7;
           biased_exponent = (high >> 17) & exponent_mask;
        }
 
        exponent = biased_exponent - exponent_bias;
        /* Create string of significand digits */
 
        /* Convert the 114-bit binary number represented by */
        /* (high, midh, midl, low) to at most 34 decimal */
        /* digits through modulo and division. */
        significand128.parts[0] = (high & 0x3fff) + ((significand_msb & 0xf) << 14);
        significand128.parts[1] = midh;
        significand128.parts[2] = midl;
        significand128.parts[3] = low;
 
        if (significand128.parts[0] == 0 && significand128.parts[1] == 0 &&
            significand128.parts[2] == 0 && significand128.parts[3] == 0) {
           is_zero = true;
        } else if (significand128.parts[0] >= (1 << 17)) {
           /* The significand is non-canonical or zero.
            * In order to preserve compatibility with the densely packed decimal
            * format, the maximum value for the significand of decimal128 is
            * 1e34 - 1.  If the value is greater than 1e34 - 1, the IEEE 754
            * standard dictates that the significand is interpreted as zero.
            */
           is_zero = true;
        } else {
           for (int k = 3; k >= 0; k--) {
              uint32_t least_digits = 0;
              detail::bson_uint128_divide1B (
                 significand128, &significand128, &least_digits);
 
              /* We now have the 9 least significant digits (in base 2). */
              /* Convert and output to string. */
              if (!least_digits) {
                 continue;
              }
 
              for (int j = 8; j >= 0; j--) {
                 significand[k * 9 + j] = least_digits % 10;
                 least_digits /= 10;
              }
           }
        }
 
        /* Output format options: */
        /* Scientific - [-]d.dddE(+/-)dd or [-]dE(+/-)dd */
        /* Regular    - ddd.ddd */
 
        if (is_zero) {
           significand_digits = 1;
           *significand_read = 0;
        } else {
           significand_digits = 36;
           while (!(*significand_read)) {
              significand_digits--;
              significand_read++;
           }
        }
 
        scientific_exponent = significand_digits - 1 + exponent;
 
        /* The scientific exponent checks are dictated by the string conversion
         * specification and are somewhat arbitrary cutoffs.
         *
         * We must check exponent > 0, because if this is the case, the number
         * has trailing zeros.  However, we *cannot* output these trailing zeros,
         * because doing so would change the precision of the value, and would
         * change stored data if the string converted number is round tripped.
         */
        if (scientific_exponent < -6 || exponent > 0) {
           /* Scientific format */
           *(str_out++) = char(*(significand_read++)) + '0';
           significand_digits--;
 
           if (significand_digits) {
              *(str_out++) = '.';
           }
 
           for (std::size_t i = 0; i < significand_digits && (str_out - first) < 36; i++) {
              *(str_out++) = char(*(significand_read++)) + '0';
           }
           /* Exponent */
           *(str_out++) = 'E';

           std::string s;
           if (scientific_exponent >= 0) {
               s.push_back('+');
           }
           jsoncons::detail::from_integer(scientific_exponent, s);
           if (str_out + s.size() < last) 
           {
               std::memcpy(str_out, s.data(), s.size());
           }
           else
           {
               return decimal128_to_chars_result{str_out, std::errc::value_too_large};
           }
           str_out += s.size();
        } else {
           /* Regular format with no decimal place */
           if (exponent >= 0) {
              for (std::size_t i = 0; i < significand_digits && (str_out - first) < 36; i++) {
                 *(str_out++) = char(*(significand_read++)) + '0';
              }
           } else {
              int32_t radix_position = significand_digits + exponent;
 
              if (radix_position > 0) { /* non-zero digits before radix */
                 for (int32_t i = 0;
                      i < radix_position && (str_out < last);
                      i++) {
                    *(str_out++) = char(*(significand_read++)) + '0';
                 }
              } else { /* leading zero before radix point */
                 *(str_out++) = '0';
              }
 
              *(str_out++) = '.';
              while (radix_position++ < 0) { /* add leading zeros after radix */
                 *(str_out++) = '0';
              }
 
              for (std::size_t i = 0;
                   (i < significand_digits - (std::max) (radix_position - 1, 0)) &&
                   (str_out < last);
                   i++) {
                 *(str_out++) = char(*(significand_read++)) + '0';
              }
           }
        }
        return decimal128_to_chars_result{str_out, std::errc()};
    }